

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

string * __thiscall
OpenMD::StringTokenizer::nextToken_abi_cxx11_(string *__return_storage_ptr__,StringTokenizer *this)

{
  value_type *pvVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  insertIter;
  insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  local_20.iter._M_current = (char *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = local_20.iter._M_current;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar3 = (this->currentPos_)._M_current;
  pcVar4 = (this->end_)._M_current;
  local_20.container = __return_storage_ptr__;
  if (pcVar3 != pcVar4) {
    while ((pcVar3 != pcVar4 && (bVar2 = isDelimiter(this,*pcVar3), bVar2))) {
      bVar2 = this->returnTokens_;
      pvVar1 = (this->currentPos_)._M_current;
      pcVar3 = pvVar1 + 1;
      (this->currentPos_)._M_current = pcVar3;
      if (bVar2 == true) {
        std::
        insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator=(&local_20,pvVar1);
        return __return_storage_ptr__;
      }
      pcVar4 = (this->end_)._M_current;
    }
    while ((pcVar3 = (this->currentPos_)._M_current, pcVar3 != (this->end_)._M_current &&
           (bVar2 = isDelimiter(this,*pcVar3), !bVar2))) {
      pvVar1 = (this->currentPos_)._M_current;
      (this->currentPos_)._M_current = pvVar1 + 1;
      std::
      insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator=(&local_20,pvVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringTokenizer::nextToken() {
    std::string result;

    if (currentPos_ != end_) {
      std::insert_iterator<std::string> insertIter(result, result.begin());

      while (currentPos_ != end_ && isDelimiter(*currentPos_)) {
        if (returnTokens_) {
          *insertIter++ = *currentPos_++;
          return result;
        }

        ++currentPos_;
      }

      while (currentPos_ != end_ && !isDelimiter(*currentPos_)) {
        *insertIter++ = *currentPos_++;
      }
    }

    return result;
  }